

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

uint32_t __thiscall AmpIO::GetMotorCurrent(AmpIO *this,uint index)

{
  quadlet_t buff;
  uint index_local;
  AmpIO *this_local;
  
  if (index < this->NumMotors) {
    this_local._4_4_ = this->ReadBuffer[index + 4] & 0xffff;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t AmpIO::GetMotorCurrent(unsigned int index) const
{
    if (index >= NumMotors)
        return 0L;

    quadlet_t buff;
    buff = ReadBuffer[index+MOTOR_CURR_OFFSET];
    buff &= MOTOR_CURR_MASK;       // mask for applicable bits

    return static_cast<uint32_t>(buff) & ADC_MASK;
}